

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubVerify.cpp
# Opt level: O0

void SubVerifyBase<long,unsigned_short>(char *types)

{
  bool bVar1;
  char *pcVar2;
  TestCase<long,_unsigned_short,_4> TVar3;
  string msg_2;
  long x;
  string msg_1;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si;
  bool fSuccess;
  string msg;
  long ret;
  TestCase<long,_unsigned_short,_4> test;
  TestVector<long,_unsigned_short,_4> tests;
  char *in_stack_fffffffffffffd88;
  allocator *in_stack_fffffffffffffd90;
  TestVector<long,_unsigned_short,_4> *in_stack_fffffffffffffd98;
  char *in_stack_fffffffffffffda0;
  long local_220;
  unsigned_short local_218;
  bool bStack_216;
  allocator local_1f9;
  string local_1f8 [13];
  undefined1 in_stack_fffffffffffffe15;
  unsigned_short in_stack_fffffffffffffe16;
  long in_stack_fffffffffffffe18;
  string *in_stack_fffffffffffffe20;
  undefined1 local_1d1 [33];
  string local_1b0 [32];
  string local_190 [38];
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_16a;
  long local_168;
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_d0;
  byte local_c2;
  allocator local_c1;
  string local_c0 [55];
  allocator local_89;
  string local_88 [32];
  string local_68 [40];
  TestCase<long,_unsigned_short,_4> local_40;
  long local_30;
  unsigned_short local_28;
  byte local_26;
  TestVector<long,_unsigned_short,_4> local_20;
  
  TestVector<long,_unsigned_short,_4>::TestVector(&local_20);
  local_40 = TestVector<long,_unsigned_short,_4>::GetNext(in_stack_fffffffffffffd98);
  local_30 = local_40.x;
  local_28 = local_40.y;
  local_26 = local_40.fExpected;
  while( true ) {
    bVar1 = TestVector<long,_unsigned_short,_4>::Done(&local_20);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    bVar1 = SafeSubtract<long,unsigned_short>
                      ((long)in_stack_fffffffffffffd90,
                       (unsigned_short)((ulong)in_stack_fffffffffffffd88 >> 0x30),(long *)0x1c006e);
    if (bVar1 != (bool)(local_26 & 1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_88,"Error in case ",&local_89);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90);
      std::__cxx11::string::~string(local_88);
      std::allocator<char>::~allocator((allocator<char> *)&local_89);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c0,pcVar2,&local_c1);
      err_msg<long,unsigned_short>
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe16,
                 (bool)in_stack_fffffffffffffe15);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
      std::__cxx11::string::~string(local_68);
    }
    local_c2 = 1;
    SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
              (&local_d0,&local_30);
    SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator-=
              ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                *)in_stack_fffffffffffffd90,
               (unsigned_short)((ulong)in_stack_fffffffffffffd88 >> 0x30));
    if ((local_c2 & 1) != (local_26 & 1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_130,"Error in case ",&local_131);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90);
      std::__cxx11::string::~string(local_110);
      std::__cxx11::string::~string(local_130);
      std::allocator<char>::~allocator((allocator<char> *)&local_131);
      in_stack_fffffffffffffda0 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_158,in_stack_fffffffffffffda0,&local_159);
      err_msg<long,unsigned_short>
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe16,
                 (bool)in_stack_fffffffffffffe15);
      std::__cxx11::string::~string(local_158);
      std::allocator<char>::~allocator((allocator<char> *)&local_159);
      std::__cxx11::string::~string(local_f0);
    }
    local_c2 = 1;
    local_168 = local_30;
    SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
    ::SafeInt(&local_16a,&local_28);
    operator-=((long *)in_stack_fffffffffffffd98,
               (SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                )(unsigned_short)((ulong)in_stack_fffffffffffffda0 >> 0x30));
    if ((local_c2 & 1) != (local_26 & 1)) {
      in_stack_fffffffffffffd98 = (TestVector<long,_unsigned_short,_4> *)local_1d1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_1d1 + 1),"Error in case ",(allocator *)in_stack_fffffffffffffd98);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90);
      std::__cxx11::string::~string(local_1b0);
      std::__cxx11::string::~string((string *)(local_1d1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_1d1);
      in_stack_fffffffffffffd88 = (char *)std::__cxx11::string::c_str();
      in_stack_fffffffffffffd90 = &local_1f9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1f8,in_stack_fffffffffffffd88,in_stack_fffffffffffffd90);
      err_msg<long,unsigned_short>
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe16,
                 (bool)in_stack_fffffffffffffe15);
      std::__cxx11::string::~string(local_1f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
      std::__cxx11::string::~string(local_190);
    }
    TVar3 = TestVector<long,_unsigned_short,_4>::GetNext(in_stack_fffffffffffffd98);
    local_220 = TVar3.x;
    local_218 = TVar3.y;
    bStack_216 = TVar3.fExpected;
    local_30 = local_220;
    local_28 = local_218;
    local_26 = bStack_216;
  }
  return;
}

Assistant:

void SubVerifyBase(const char* types)
{
    TestVector< T, U, OpType::Sub > tests;
    TestCase< T, U, OpType::Sub > test = tests.GetNext();

    while (!tests.Done())
    {
        T ret;
        if (SafeSubtract(test.x, test.y, ret) != test.fExpected)
        {
            std::string msg = std::string("Error in case ") + types;
            err_msg(msg.c_str(), test.x, test.y, test.fExpected);
        }

        // Now test throwing version
        bool fSuccess = true;
        try
        {
            SafeInt<T> si(test.x);
            si -= test.y;
        }
        catch (...)
        {
            fSuccess = false;
        }

        if (fSuccess != test.fExpected)
        {
            std::string msg = std::string("Error in case ") + types + " throw (1): ";
            err_msg(msg.c_str(), test.x, test.y, test.fExpected);
        }

        // Also need to test the version that assigns back out
        // to a plain int, as it has different logic
        fSuccess = true;
        try
        {
            T x(test.x);
            x -= SafeInt<U>(test.y);
        }
        catch (...)
        {
            fSuccess = false;
        }

        if (fSuccess != test.fExpected)
        {
            std::string msg = std::string("Error in case ") + types + " throw (2): ";
            err_msg(msg.c_str(), test.x, test.y, test.fExpected);
        }

        test = tests.GetNext();
    }
}